

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

string * fmt::v8::vformat_abi_cxx11_(string_view fmt,format_args args)

{
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_RDI;
  memory_buffer buffer;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this;
  locale_ref local_280 [7];
  allocator<char> local_241 [17];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  buffer<char> *in_stack_fffffffffffffe88;
  locale_ref in_stack_fffffffffffffe90;
  basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>
  in_stack_fffffffffffffe98;
  basic_string_view<char> in_stack_fffffffffffffea8;
  
  this = in_RDI;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            (this,(allocator<char> *)in_RDI);
  std::allocator<char>::~allocator(local_241);
  detail::locale_ref::locale_ref(local_280);
  detail::vformat_to<char>
            (in_stack_fffffffffffffe88,in_stack_fffffffffffffea8,in_stack_fffffffffffffe98,
             in_stack_fffffffffffffe90);
  to_string<char,500ul>(in_stack_fffffffffffffdd0);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(this);
  return (string *)this;
}

Assistant:

FMT_FUNC std::string vformat(string_view fmt, format_args args) {
  // Don't optimize the "{}" case to keep the binary size small and because it
  // can be better optimized in fmt::format anyway.
  auto buffer = memory_buffer();
  detail::vformat_to(buffer, fmt, args);
  return to_string(buffer);
}